

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayoutPrivate::recalcHFW(QFormLayoutPrivate *this,int w)

{
  int iVar1;
  QLayoutStruct *pQVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  setupHfwLayoutData(this);
  if ((long)this->vLayoutCount < 1) {
    iVar3 = 0;
    iVar4 = 0;
  }
  else {
    pQVar2 = (this->hfwLayouts).d.ptr;
    lVar6 = 0;
    iVar4 = 0;
    iVar3 = 0;
    do {
      iVar1 = *(int *)((long)&pQVar2->spacing + lVar6);
      iVar3 = iVar3 + iVar1 + *(int *)((long)&pQVar2->sizeHint + lVar6);
      iVar4 = iVar4 + iVar1 + *(int *)((long)&pQVar2->minimumSize + lVar6);
      lVar6 = lVar6 + 0x20;
    } while ((long)this->vLayoutCount * 0x20 != lVar6);
  }
  if (this->sh_width < 1 || this->sh_width != w) {
    lVar6 = 0xf8;
    lVar5 = 0xf4;
  }
  else {
    w = 0x7ffff;
    if (iVar3 < 0x7ffff) {
      w = iVar3;
    }
    lVar6 = 0x100;
    lVar5 = 0xfc;
    iVar3 = iVar4;
  }
  *(int *)(&(this->super_QLayoutPrivate).super_QObjectPrivate + lVar5) = w;
  iVar4 = 0x7ffff;
  if (iVar3 < 0x7ffff) {
    iVar4 = iVar3;
  }
  *(int *)(&(this->super_QLayoutPrivate).super_QObjectPrivate + lVar6) = iVar4;
  return;
}

Assistant:

void QFormLayoutPrivate::recalcHFW(int w)
{
    setupHfwLayoutData();

    int h = 0;
    int mh = 0;

    for (int r = 0; r < vLayoutCount; ++r) {
        int spacing = hfwLayouts.at(r).spacing;
        h += hfwLayouts.at(r).sizeHint + spacing;
        mh += hfwLayouts.at(r).minimumSize + spacing;
    }

    if (sh_width > 0 && sh_width == w) {
        hfw_sh_height = qMin(QLAYOUTSIZE_MAX, h);
        hfw_sh_minheight = qMin(QLAYOUTSIZE_MAX, mh);
    } else {
        hfw_width = w;
        hfw_height = qMin(QLAYOUTSIZE_MAX, h);
    }
}